

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void mxx::print_node_distribution(MPI_Comm comm)

{
  _func_int **pp_Var1;
  _Rb_tree_header *p_Var2;
  iterator __position;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int iVar5;
  pointer ppVar6;
  char *pcVar7;
  vector<int,std::allocator<int>> *this;
  ulong uVar8;
  _Base_ptr p_Var9;
  ostream *poVar10;
  char *pcVar11;
  long lVar12;
  pointer ppVar13;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  __i;
  pointer pcVar14;
  long lVar15;
  pointer ppVar16;
  int *piVar17;
  int p;
  int rank;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  proc_distr;
  vector<char,_std::allocator<char>_> all_names_raw;
  int p_len;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_names;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  procs_per_node;
  char p_name [257];
  int local_1fc;
  int local_1f8;
  int local_1f4;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_1f0;
  vector<char,_std::allocator<char>_> local_1d8;
  int local_1bc;
  undefined1 local_1b8 [20];
  undefined1 local_1a4 [12];
  pointer local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_168;
  char local_138 [264];
  
  MPI_Comm_rank(comm,&local_1f4);
  MPI_Comm_size(comm,&local_1f8);
  MPI_Get_processor_name(local_138,&local_1bc);
  local_138[local_1bc] = '\0';
  pp_Var1 = (_func_int **)(local_1b8 + 0x10);
  local_1b8._0_8_ = &PTR__comm_001a58a0;
  local_1a4[4] = false;
  local_1b8._8_8_ = comm;
  MPI_Comm_size(comm,pp_Var1);
  MPI_Comm_rank(local_1b8._8_8_,local_1a4);
  gatherv<char>(&local_1d8,local_138,(long)local_1bc + 1,0,(comm *)local_1b8);
  mxx::comm::~comm((comm *)local_1b8);
  if (local_1f4 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_180,(long)local_1f8,(allocator_type *)local_1b8);
    local_1fc = 0;
    if (local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pcVar7 = local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar11 = local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar14 = local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (*pcVar14 == '\0') {
          local_1b8._0_8_ = pp_Var1;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((string *)local_1b8,pcVar11,pcVar14);
          lVar12 = (long)local_1fc;
          local_1fc = local_1fc + 1;
          std::__cxx11::string::operator=
                    ((string *)
                     (local_180.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar12),(string *)local_1b8);
          if ((_func_int **)local_1b8._0_8_ != pp_Var1) {
            operator_delete((void *)local_1b8._0_8_);
          }
          pcVar11 = pcVar14 + 1;
          pcVar7 = local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        pcVar14 = pcVar14 + 1;
      } while (pcVar14 != pcVar7);
    }
    iVar5 = local_1fc;
    if (local_1fc != local_1f8) {
      __assert_fail("i == p",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/utils.hpp"
                    ,0x5a,"void mxx::print_node_distribution(MPI_Comm)");
    }
    p_Var2 = &local_168._M_impl.super__Rb_tree_header;
    local_168._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_168._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_168._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1fc = 0;
    local_168._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_168._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    if (0 < iVar5) {
      do {
        this = (vector<int,std::allocator<int>> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                             *)&local_168,
                            local_180.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_1fc);
        __position._M_current = *(int **)(this + 8);
        if (__position._M_current == *(int **)(this + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this,__position,&local_1fc);
        }
        else {
          *__position._M_current = local_1fc;
          *(int **)(this + 8) = __position._M_current + 1;
        }
        local_1fc = local_1fc + 1;
      } while (local_1fc < local_1f8);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::vector(&local_1f0,local_168._M_impl.super__Rb_tree_header._M_node_count,
             (allocator_type *)local_1b8);
    local_1fc = 0;
    if ((_Rb_tree_header *)local_168._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var9 = local_168._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var3 = *(_Base_ptr *)(p_Var9 + 2);
        p_Var4 = p_Var9[2]._M_parent;
        if (p_Var3 != p_Var4) {
          uVar8 = (long)p_Var4 - (long)p_Var3 >> 2;
          lVar12 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar12 == 0; lVar12 = lVar12 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (p_Var3,p_Var4,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (p_Var3,p_Var4);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
        ::pair<std::vector<int,_std::allocator<int>_>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    *)local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1)
                   ,(vector<int,_std::allocator<int>_> *)(p_Var9 + 2));
        lVar12 = (long)local_1fc;
        local_1fc = local_1fc + 1;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
        ::operator=(local_1f0.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar12,
                    (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                     *)local_1b8);
        if (local_198 != (pointer)0x0) {
          operator_delete(local_198);
        }
        if ((_func_int **)local_1b8._0_8_ != pp_Var1) {
          operator_delete((void *)local_1b8._0_8_);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var2);
    }
    ppVar6 = local_1f0.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar13 = local_1f0.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_1f0.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1f0.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar15 = (long)local_1f0.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1f0.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (lVar15 >> 3) * 0x6db6db6db6db6db7;
      lVar12 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<mxx::print_node_distribution(ompi_communicator_t*)::__0>>
                (local_1f0.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_1f0.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar15 < 0x381) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<mxx::print_node_distribution(ompi_communicator_t*)::__0>>
                  (ppVar13,ppVar6);
      }
      else {
        ppVar16 = ppVar13 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<mxx::print_node_distribution(ompi_communicator_t*)::__0>>
                  (ppVar13,ppVar16);
        for (; ppVar16 != ppVar6; ppVar16 = ppVar16 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__ops::_Val_comp_iter<mxx::print_node_distribution(ompi_communicator_t*)::__0>>
                    (ppVar16);
        }
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"== Node distribution == ",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"== p=",5);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," processes on ",0xe);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," nodes ==",9);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    ppVar13 = local_1f0.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_1f0.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1f0.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"--  Node: \'",0xb)
        ;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(ppVar13->first)._M_dataplus._M_p,
                             (ppVar13->first)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\' (",3);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/",1);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"        Ranks: ",0xf);
        piVar17 = (ppVar13->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        while (piVar17 !=
               (ppVar13->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish) {
          std::ostream::operator<<(&std::cerr,*piVar17);
          piVar17 = piVar17 + 1;
          if (piVar17 ==
              (ppVar13->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", ",2);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
        std::ostream::put('p');
        std::ostream::flush();
        ppVar13 = ppVar13 + 1;
      } while (ppVar13 !=
               local_1f0.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector(&local_1f0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_180);
  }
  if (local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void print_node_distribution(MPI_Comm comm = MPI_COMM_WORLD)
{
    // get MPI parameters
    int rank;
    int p;
    MPI_Comm_rank(comm, &rank);
    MPI_Comm_size(comm, &p);

    // get local processor name
    char p_name[MPI_MAX_PROCESSOR_NAME+1];
    int p_len;
    MPI_Get_processor_name(p_name, &p_len);
    p_name[p_len] = '\0'; // make string NULL-terminated (if not yet so)

    // gather all processor names to master
    // TODO: use gather with string specialization!
    std::vector<char> all_names_raw = gatherv(p_name,p_len+1, 0,comm);

    if (rank == 0)
    {
        std::vector<std::string> all_names(p);
        // disect the names into a set of strings
        std::vector<char>::iterator str_start = all_names_raw.begin();
        int i = 0;
        for (auto it = all_names_raw.begin(); it != all_names_raw.end(); ++it)
        {
            if (*it == '\0')
            {
                all_names[i++] = std::string(str_start, it);
                str_start = it+1;
            }
        }
        assert(i == p);
        std::map<std::string, std::vector<int> > procs_per_node;
        for (i = 0; i < p; ++i)
        {
            procs_per_node[all_names[i]].push_back(i);
        }
        // create array instead of map, then we can sort by first rank
        std::vector<std::pair<std::string, std::vector<int> > > proc_distr(procs_per_node.size());
        i = 0;
        for (auto it = procs_per_node.begin(); it != procs_per_node.end(); ++it)
        {
            // sort procs on each node
            std::sort(it->second.begin(), it->second.end());
            // put into the vector
            proc_distr[i++] = std::make_pair(it->first, it->second);
        }
        // sort the vector of node names by first rank
        std::sort(proc_distr.begin(), proc_distr.end(),
                  [](const std::pair<std::string, std::vector<int> >& x,
                     const std::pair<std::string, std::vector<int> >& y)
                  { return x.second.front() < y.second.front();});

        // print out the rank distribution
        std::cerr << "== Node distribution == " << std::endl;
        std::cerr << "== p=" << p << " processes on " << proc_distr.size() << " nodes ==" << std::endl;
        for (auto it = proc_distr.begin(); it != proc_distr.end(); ++it)
        {
            std::cerr << "--  Node: '" << it->first << "' (" << it->second.size() << "/" << p << ")" << std::endl;
            std::cerr << "        Ranks: ";
            for (auto rank_it = it->second.begin(); rank_it != it->second.end(); ++rank_it)
            {
                std::cerr << *rank_it;
                if (rank_it+1 != it->second.end())
                    std::cerr << ", ";
            }
            std::cerr << std::endl;
        }
    }
}